

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O1

Abc_Obj_t * Lpk_Implement(Lpk_Man_t *pMan,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLeaves,int nLeavesOld)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = vLeaves->nSize;
  if ((int)uVar1 <= nLeavesOld) {
    __assert_fail("nLeavesOld < Vec_PtrSize(vLeaves)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDec.c"
                  ,0x7c,"Abc_Obj_t *Lpk_Implement(Lpk_Man_t *, Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  if (0 < nLeavesOld) {
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    do {
      if (uVar4 == uVar3) goto LAB_004e0dbd;
      vLeaves->pArray[uVar3] = (void *)((ulong)vLeaves->pArray[uVar3] ^ 1);
      uVar3 = uVar3 + 1;
    } while ((uint)nLeavesOld != uVar3);
  }
  if ((-1 < nLeavesOld) && (nLeavesOld < (int)uVar1)) {
    pAVar2 = Lpk_Implement_rec(pMan,pNtk,vLeaves,(Lpk_Fun_t *)vLeaves->pArray[(uint)nLeavesOld]);
    if (nLeavesOld <= vLeaves->nSize) {
      vLeaves->nSize = nLeavesOld;
      return pAVar2;
    }
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
LAB_004e0dbd:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Obj_t * Lpk_Implement( Lpk_Man_t * pMan, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLeaves, int nLeavesOld )
{
    Abc_Obj_t * pFanin, * pRes;
    int i;
    assert( nLeavesOld < Vec_PtrSize(vLeaves) );
    // mark implemented nodes
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vLeaves, pFanin, i, nLeavesOld )
        Vec_PtrWriteEntry( vLeaves, i, Abc_ObjNot(pFanin) );
    // recursively construct starting from the first entry
    pRes = Lpk_Implement_rec( pMan, pNtk, vLeaves, (Lpk_Fun_t *)Vec_PtrEntry( vLeaves, nLeavesOld ) );
    Vec_PtrShrink( vLeaves, nLeavesOld );
    return pRes;
}